

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsProxyWidget *this)

{
  QGraphicsSceneHoverEvent *in_stack_00000018;
  QGraphicsProxyWidget *in_stack_00000020;
  
  hoverLeaveEvent(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsProxyWidget);
    // If hoverMove was compressed away, make sure we update properly here.
    if (d->lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
        d->lastWidgetUnderMouse = nullptr;
    }
}